

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall
QDockAreaLayoutItem::QDockAreaLayoutItem(QDockAreaLayoutItem *this,QDockAreaLayoutItem *other)

{
  QDockAreaLayoutInfo *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QPlaceHolderItem *pQVar4;
  Data *pDVar5;
  QMainWindow *pQVar6;
  QTabBar *pQVar7;
  int iVar8;
  Representation RVar9;
  DockPosition DVar10;
  Orientation OVar11;
  Representation RVar12;
  Representation RVar13;
  undefined7 uVar14;
  bool bVar15;
  undefined2 uVar16;
  QDockAreaLayoutInfo *pQVar17;
  QPlaceHolderItem *pQVar18;
  
  this->widgetItem = other->widgetItem;
  this->subinfo = (QDockAreaLayoutInfo *)0x0;
  this->placeHolderItem = (QPlaceHolderItem *)0x0;
  iVar8 = other->size;
  this->pos = other->pos;
  this->size = iVar8;
  this->flags = other->flags;
  pQVar1 = other->subinfo;
  if (pQVar1 == (QDockAreaLayoutInfo *)0x0) {
    pQVar4 = other->placeHolderItem;
    if (pQVar4 != (QPlaceHolderItem *)0x0) {
      pQVar18 = (QPlaceHolderItem *)operator_new(0x30);
      pDVar5 = (pQVar4->objectName).d.d;
      (pQVar18->objectName).d.d = pDVar5;
      (pQVar18->objectName).d.ptr = (pQVar4->objectName).d.ptr;
      (pQVar18->objectName).d.size = (pQVar4->objectName).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      (pQVar18->topLevelRect).y2.m_i = (pQVar4->topLevelRect).y2.m_i;
      bVar15 = pQVar4->window;
      uVar16 = *(undefined2 *)&pQVar4->field_0x1a;
      RVar9.m_i = (pQVar4->topLevelRect).x1.m_i;
      RVar12.m_i = (pQVar4->topLevelRect).y1.m_i;
      RVar13.m_i = (pQVar4->topLevelRect).x2.m_i;
      pQVar18->hidden = pQVar4->hidden;
      pQVar18->window = bVar15;
      *(undefined2 *)&pQVar18->field_0x1a = uVar16;
      (pQVar18->topLevelRect).x1 = (Representation)RVar9.m_i;
      (pQVar18->topLevelRect).y1 = (Representation)RVar12.m_i;
      (pQVar18->topLevelRect).x2 = (Representation)RVar13.m_i;
      this->placeHolderItem = pQVar18;
    }
  }
  else {
    pQVar17 = (QDockAreaLayoutInfo *)operator_new(0x70);
    pQVar17->sep = pQVar1->sep;
    pDVar2 = (pQVar1->separatorWidgets).d.d;
    (pQVar17->separatorWidgets).d.d = pDVar2;
    (pQVar17->separatorWidgets).d.ptr = (pQVar1->separatorWidgets).d.ptr;
    (pQVar17->separatorWidgets).d.size = (pQVar1->separatorWidgets).d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    DVar10 = pQVar1->dockPos;
    OVar11 = pQVar1->o;
    RVar12.m_i = (pQVar1->rect).x1.m_i;
    RVar13.m_i = (pQVar1->rect).y1.m_i;
    RVar9.m_i = (pQVar1->rect).y2.m_i;
    pQVar6 = pQVar1->mainWindow;
    (pQVar17->rect).x2 = (Representation)(pQVar1->rect).x2.m_i;
    (pQVar17->rect).y2 = (Representation)RVar9.m_i;
    pQVar17->mainWindow = pQVar6;
    pQVar17->dockPos = DVar10;
    pQVar17->o = OVar11;
    (pQVar17->rect).x1 = (Representation)RVar12.m_i;
    (pQVar17->rect).y1 = (Representation)RVar13.m_i;
    pDVar3 = (pQVar1->item_list).d.d;
    (pQVar17->item_list).d.d = pDVar3;
    (pQVar17->item_list).d.ptr = (pQVar1->item_list).d.ptr;
    (pQVar17->item_list).d.size = (pQVar1->item_list).d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar17->tabBarShape = pQVar1->tabBarShape;
    uVar14 = *(undefined7 *)&pQVar1->field_0x59;
    pQVar7 = pQVar1->tabBar;
    pQVar17->tabbed = pQVar1->tabbed;
    *(undefined7 *)&pQVar17->field_0x59 = uVar14;
    pQVar17->tabBar = pQVar7;
    this->subinfo = pQVar17;
  }
  return;
}

Assistant:

QDockAreaLayoutItem::QDockAreaLayoutItem(const QDockAreaLayoutItem &other)
    : widgetItem(other.widgetItem), subinfo(nullptr), placeHolderItem(nullptr), pos(other.pos),
        size(other.size), flags(other.flags)
{
    if (other.subinfo != nullptr)
        subinfo = new QDockAreaLayoutInfo(*other.subinfo);
    else if (other.placeHolderItem != nullptr)
        placeHolderItem = new QPlaceHolderItem(*other.placeHolderItem);
}